

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char_const(&)[64],std::__cxx11::string_const&,char_const(&)[32],char_const*,char_const(&)[11],std::__cxx11::string&,char_const(&)[3]>
                   (string *__return_storage_ptr__,char (*a) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [64],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [32],char **args_3,char (*args_4) [11],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [3])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_300;
  cmAlphaNum local_2c8;
  cmAlphaNum local_290;
  cmAlphaNum local_258;
  cmAlphaNum local_220;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b0;
  cmAlphaNum local_178;
  cmAlphaNum local_140;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_108;
  string_view local_f0;
  string *local_e0;
  string_view local_d8;
  string *local_c8;
  string_view local_c0;
  string *local_b0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  cmAlphaNum::cmAlphaNum(&local_140,*a);
  local_108.first = cmAlphaNum::View(&local_140);
  local_108.second = local_140.RValueString_;
  local_178.RValueString_ = (string *)0x0;
  local_178.View_._M_str = (b->_M_dataplus)._M_p;
  local_178.View_._M_len = b->_M_string_length;
  local_f0 = cmAlphaNum::View(&local_178);
  local_e0 = local_178.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_1b0,*args);
  local_d8 = cmAlphaNum::View(&local_1b0);
  local_c8 = local_1b0.RValueString_;
  local_1e8.RValueString_ = (string *)0x0;
  local_1e8.View_._M_str = (args_1->_M_dataplus)._M_p;
  local_1e8.View_._M_len = args_1->_M_string_length;
  local_c0 = cmAlphaNum::View(&local_1e8);
  local_b0 = local_1e8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_220,*args_2);
  local_a8 = cmAlphaNum::View(&local_220);
  local_98 = local_220.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_258,*args_3);
  local_90 = cmAlphaNum::View(&local_258);
  local_80 = local_258.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_290,*args_4);
  local_78 = cmAlphaNum::View(&local_290);
  local_68 = local_290.RValueString_;
  local_2c8.RValueString_ = (string *)0x0;
  local_2c8.View_._M_str = (args_5->_M_dataplus)._M_p;
  local_2c8.View_._M_len = args_5->_M_string_length;
  local_60 = cmAlphaNum::View(&local_2c8);
  local_50 = local_2c8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_300,*args_6);
  local_48 = cmAlphaNum::View(&local_300);
  local_38 = local_300.RValueString_;
  views._M_len = 9;
  views._M_array = &local_108;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}